

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginLoopIfCharInst::Exec
          (BeginLoopIfCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  code *pcVar2;
  bool bVar3;
  LoopInfo *pLVar4;
  undefined4 *puVar5;
  GroupInfo *pGVar6;
  uint8 *puVar7;
  int groupId;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    pLVar4 = Matcher::LoopIdToLoopInfo
                       (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
    groupId = (this->super_BodyGroupsMixin).minBodyGroupId;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (; groupId <= (this->super_BodyGroupsMixin).maxBodyGroupId; groupId = groupId + 1) {
      pGVar6 = Matcher::GroupIdToGroupInfo(matcher,groupId);
      if (pGVar6->length != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xbf5,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                           "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    pLVar4->number = 0;
    *instPointer = *instPointer + 0x1d;
  }
  else {
    if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower != 0) {
      bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar3;
    }
    puVar7 = Matcher::LabelToInstPointer(matcher,(this->super_BeginLoopMixin).exitLabel);
    *instPointer = puVar7;
  }
  return false;
}

Assistant:

inline bool BeginLoopIfCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // Commit to at least one iteration of loop
            LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

            // All inner groups must begin reset
#if DBG
            for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
            {
                Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
            }
#endif
            loopInfo->number = 0;
            instPointer += sizeof(*this);
            return false;
        }

        if (repeats.lower > 0)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer = matcher.LabelToInstPointer(exitLabel);
        return false;
    }